

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# properties.cc
# Opt level: O2

void __thiscall gutil::Properties::saveOctave(Properties *this,ostream *out,char *comment)

{
  _Base_ptr p_Var1;
  ostream *poVar2;
  char *pcVar3;
  shared_ptr<gutil::PropertyNode> root;
  undefined1 local_50 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  undefined1 local_30 [16];
  
  pcVar3 = "Converted properties";
  if (comment != (char *)0x0) {
    pcVar3 = comment;
  }
  local_40._M_allocated_capacity = (size_type)local_30;
  local_40._8_8_ = 0;
  local_30[0] = 0;
  std::make_shared<gutil::PropertyNode,std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
  std::__cxx11::string::~string((string *)(local_50 + 0x10));
  for (p_Var1 = (this->data)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->data)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    PropertyNode::addChild
              ((PropertyNode *)local_50._0_8_,(string *)(p_Var1 + 1),(string *)(p_Var1 + 2));
  }
  poVar2 = std::operator<<(out,"# ");
  poVar2 = std::operator<<(poVar2,pcVar3);
  std::endl<char,std::char_traits<char>>(poVar2);
  PropertyNode::saveOctave((PropertyNode *)local_50._0_8_,out);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_50 + 8));
  return;
}

Assistant:

void Properties::saveOctave(std::ostream& out, const char *comment) const
{
  if (comment == 0)
  {
    comment="Converted properties";
  }

  std::shared_ptr<PropertyNode> root=std::make_shared<PropertyNode>(std::string());

  for (std::map<std::string, std::string>::const_iterator it=data.begin(); it!=data.end(); ++it)
  {
    root->addChild(it->first, it->second);
  }

  out << "# " << comment << std::endl;
  root->saveOctave(out);
}